

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pystring.cpp
# Opt level: O0

string * pystring::upper(string *__return_storage_ptr__,string *str)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  undefined1 *puVar4;
  undefined8 local_30;
  size_type i;
  size_type len;
  string *str_local;
  string *s;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  uVar2 = std::__cxx11::string::size();
  for (local_30 = 0; local_30 < uVar2; local_30 = local_30 + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    iVar1 = ::islower((int)*pcVar3);
    if (iVar1 != 0) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
      iVar1 = toupper((int)*pcVar3);
      puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
      *puVar4 = (char)iVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string upper( const std::string & str )
    {
        std::string s( str ) ;
        std::string::size_type len = s.size(), i;

        for ( i = 0; i < len; ++i )
        {
            if ( ::islower( s[i] ) ) s[i] = (char) ::toupper( s[i] );
        }

        return s;
    }